

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkCollectDistrib(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  
  if (1 < (p->vObjType).nSize) {
    lVar4 = 1;
    do {
      if ((p->vObjType).nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (p->vObjType).pArray[lVar4];
      if (0xffffffa8 < bVar1 - 0x5a) {
        if (bVar1 == 3) {
          if ((p->vObjFunc).nSize < 1) {
            lVar2 = 0;
          }
          else {
            Vec_IntFillExtra(&p->vObjFunc,(int)lVar4 + 1,0);
            if ((p->vObjFunc).nSize <= lVar4) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar2 = (long)(p->vObjFunc).pArray[lVar4];
          }
          piVar3 = pUserCounts + lVar2;
        }
        else {
          piVar3 = pCounts + bVar1;
        }
        *piVar3 = *piVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vObjType).nSize);
  }
  return;
}

Assistant:

void Cba_NtkCollectDistrib( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    int i;
    Cba_NtkForEachBox( p, i )
        if ( Cba_ObjIsBoxUser(p, i) )
            pUserCounts[Cba_ObjNtkId(p, i)]++;
        else
            pCounts[Cba_ObjType(p, i)]++;
}